

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.cpp
# Opt level: O0

char * u_errorName_63(UErrorCode code)

{
  char *pcStack_10;
  UErrorCode code_local;
  
  if ((code < U_ZERO_ERROR) || (U_NO_WRITE_PERMISSION < code)) {
    if ((code < U_ERROR_WARNING_START) || (U_PLUGIN_CHANGED_LEVEL_WARNING < code)) {
      if ((code < U_BAD_VARIABLE_DEFINITION) || (U_INVALID_FUNCTION < code)) {
        if ((code < U_FMT_PARSE_ERROR_START) || (U_NUMBER_SKELETON_SYNTAX_ERROR < code)) {
          if ((code < U_BRK_ERROR_START) || (U_BRK_MALFORMED_RULE_TAG < code)) {
            if ((code < U_REGEX_ERROR_START) || (U_REGEX_INVALID_CAPTURE_GROUP_NAME < code)) {
              if ((code < U_IDNA_ERROR_START) || (U_IDNA_DOMAIN_NAME_TOO_LONG_ERROR < code)) {
                if ((code < U_PLUGIN_ERROR_START) || (U_PLUGIN_DIDNT_SET_LEVEL < code)) {
                  pcStack_10 = "[BOGUS UErrorCode]";
                }
                else {
                  pcStack_10 = _uPluginErrorName[code + 0xfffefb00];
                }
              }
              else {
                pcStack_10 = _uIDNAErrorName[code + 0xfffefc00];
              }
            }
            else {
              pcStack_10 = _uRegexErrorName[code + 0xfffefd00];
            }
          }
          else {
            pcStack_10 = _uBrkErrorName[code + 0xfffefe00];
          }
        }
        else {
          pcStack_10 = _uFmtErrorName[code + 0xfffeff00];
        }
      }
      else {
        pcStack_10 = _uTransErrorName[code + 0xffff0000];
      }
    }
    else {
      pcStack_10 = _uErrorInfoName[code + 0x80];
    }
  }
  else {
    pcStack_10 = _uErrorName[code];
  }
  return pcStack_10;
}

Assistant:

U_CAPI const char * U_EXPORT2
u_errorName(UErrorCode code) {
    if(U_ZERO_ERROR <= code && code < U_STANDARD_ERROR_LIMIT) {
        return _uErrorName[code];
    } else if(U_ERROR_WARNING_START <= code && code < U_ERROR_WARNING_LIMIT) {
        return _uErrorInfoName[code - U_ERROR_WARNING_START];
    } else if(U_PARSE_ERROR_START <= code && code < U_PARSE_ERROR_LIMIT){
        return _uTransErrorName[code - U_PARSE_ERROR_START];
    } else if(U_FMT_PARSE_ERROR_START <= code && code < U_FMT_PARSE_ERROR_LIMIT){
        return _uFmtErrorName[code - U_FMT_PARSE_ERROR_START];
    } else if (U_BRK_ERROR_START <= code  && code < U_BRK_ERROR_LIMIT){
        return _uBrkErrorName[code - U_BRK_ERROR_START];
    } else if (U_REGEX_ERROR_START <= code && code < U_REGEX_ERROR_LIMIT) {
        return _uRegexErrorName[code - U_REGEX_ERROR_START];
    } else if(U_IDNA_ERROR_START <= code && code < U_IDNA_ERROR_LIMIT) {
        return _uIDNAErrorName[code - U_IDNA_ERROR_START];
    } else if(U_PLUGIN_ERROR_START <= code && code < U_PLUGIN_ERROR_LIMIT) {
        return _uPluginErrorName[code - U_PLUGIN_ERROR_START];
    } else {
        return "[BOGUS UErrorCode]";
    }
}